

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void make_write_cache(vw *all,string *newname,bool quiet)

{
  io_buf *piVar1;
  uint uVar2;
  ostream *poVar3;
  size_t v_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string temp;
  
  piVar1 = all->p->output;
  if ((piVar1->files)._end != (piVar1->files)._begin) {
    poVar3 = std::operator<<(&(all->trace_message).super_ostream,
                             "Warning: you tried to make two write caches.  Only the first one will be made."
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  std::__cxx11::string::string((string *)&local_70,".writing",(allocator *)&v_length);
  std::operator+(&temp,newname,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  push_many<char>(&piVar1->currentname,temp._M_dataplus._M_p,temp._M_string_length + 1);
  uVar2 = (**piVar1->_vptr_io_buf)(piVar1,temp._M_dataplus._M_p,(ulong)all->stdin_off,2);
  if (uVar2 == 0xffffffff) {
    poVar3 = std::operator<<(&(all->trace_message).super_ostream,"can\'t create cache file !");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    version_struct::to_string_abi_cxx11_(&local_70,&version);
    std::__cxx11::string::~string((string *)&local_70);
    v_length = local_70._M_string_length + 1;
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar2,&v_length,8);
    version_struct::to_string_abi_cxx11_(&local_70,&version);
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar2,local_70._M_dataplus._M_p,v_length);
    std::__cxx11::string::~string((string *)&local_70);
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar2,"c",1);
    (*piVar1->_vptr_io_buf[6])(piVar1,(ulong)uVar2,&all->num_bits,4);
    push_many<char>(&piVar1->finalname,(newname->_M_dataplus)._M_p,newname->_M_string_length + 1);
    all->p->write_cache = true;
    if (!quiet) {
      poVar3 = std::operator<<(&(all->trace_message).super_ostream,"creating cache_file = ");
      poVar3 = std::operator<<(poVar3,(string *)newname);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::__cxx11::string::~string((string *)&temp);
  return;
}

Assistant:

void make_write_cache(vw& all, string& newname, bool quiet)
{
  io_buf* output = all.p->output;
  if (output->files.size() != 0)
  {
    all.trace_message << "Warning: you tried to make two write caches.  Only the first one will be made." << endl;
    return;
  }

  string temp = newname + string(".writing");
  push_many(output->currentname, temp.c_str(), temp.length() + 1);

  int f = output->open_file(temp.c_str(), all.stdin_off, io_buf::WRITE);
  if (f == -1)
  {
    all.trace_message << "can't create cache file !" << endl;
    return;
  }

  size_t v_length = (uint64_t)version.to_string().length() + 1;

  output->write_file(f, &v_length, sizeof(v_length));
  output->write_file(f, version.to_string().c_str(), v_length);
  output->write_file(f, "c", 1);
  output->write_file(f, &all.num_bits, sizeof(all.num_bits));

  push_many(output->finalname, newname.c_str(), newname.length() + 1);
  all.p->write_cache = true;
  if (!quiet)
    all.trace_message << "creating cache_file = " << newname << endl;
}